

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O0

void Gia_ManAddTwo(Gia_Man_t *p,int iFrame,Gia_Obj_t *pObj,int Value)

{
  int nWords;
  Vec_Int_t *vData;
  int iObj;
  int Value_local;
  Gia_Obj_t *pObj_local;
  int iFrame_local;
  Gia_Man_t *p_local;
  
  vData = p->vTruths;
  nWords = p->nTtWords;
  iObj = Gia_ObjId(p,pObj);
  Abc_InfoAdd2Bits(vData,nWords,iFrame,iObj,Value);
  return;
}

Assistant:

static inline void Gia_ManAddTwo( Gia_Man_t * p, int iFrame, Gia_Obj_t * pObj, int Value )   { Abc_InfoAdd2Bits( p->vTruths, p->nTtWords, iFrame, Gia_ObjId(p, pObj), Value ); }